

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase93::run(TestCase93 *this)

{
  Builder builder_00;
  Builder builder_01;
  bool bVar1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar2;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  size_t local_460;
  int local_458;
  bool local_451;
  size_t sStack_450;
  bool _kj_shouldLog_2;
  int local_448;
  DebugExpression<int> local_444;
  undefined1 local_440 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_3;
  Builder local_408;
  size_t local_3e0;
  int local_3d8;
  bool local_3d1;
  size_t sStack_3d0;
  bool _kj_shouldLog_1;
  int local_3c8;
  DebugExpression<int> local_3c4;
  undefined1 local_3c0 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_2;
  int64_t local_370;
  int local_368;
  bool local_361;
  undefined1 local_360 [7];
  bool _kj_shouldLog;
  int64_t local_338;
  int local_330;
  DebugExpression<int> local_32c;
  undefined1 local_328 [8];
  DebugComparison<int,_long> _kjCondition_1;
  Builder local_2d8;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> local_2b0;
  undefined1 local_2a0 [8];
  TestInitMessageBuilder builder2;
  Mapper<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_&> local_1b8;
  undefined1 local_1b0 [8];
  Array<capnp::MessageBuilder::SegmentInit> segInits;
  int local_18c;
  Fault local_188;
  Fault f;
  int local_178;
  DebugExpression<int> local_174;
  undefined1 local_170 [8];
  DebugComparison<int,_unsigned_long> _kjCondition;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segs;
  Builder local_128;
  undefined1 local_100 [8];
  MallocMessageBuilder builder;
  TestCase93 *this_local;
  
  builder.moreSegments.builder.disposer = (ArrayDisposer *)this;
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)local_100,1,FIXED_SIZE);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_128,(MessageBuilder *)local_100);
  builder_00._builder.capTable = (CapTableBuilder *)local_128._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_128._builder.capTable;
  builder_00._builder.data = local_128._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_128._builder._32_8_;
  builder_00._builder.dataSize = in_stack_fffffffffffffb50;
  builder_00._builder._36_4_ = in_stack_fffffffffffffb54;
  initTestMessage(builder_00);
  AVar2 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)local_100);
  _kjCondition._32_8_ = AVar2.ptr;
  local_178 = 1;
  local_174 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_178);
  f.exception = (Exception *)
                kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                          ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result)
  ;
  kj::_::DebugExpression<int>::operator!=
            ((DebugComparison<int,_unsigned_long> *)local_170,&local_174,(unsigned_long *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_170);
  if (bVar1) {
    kj::_::Mapper<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_&>::Mapper
              (&local_1b8,(ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result);
    kj::_::Mapper<kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_message_test_c__:105:19)>
              ((Array<capnp::MessageBuilder::SegmentInit> *)local_1b0,&local_1b8,
               (anon_class_1_0_00000001 *)((long)&builder2.allocations.builder.disposer + 7));
    local_2b0 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_1b0);
    TestInitMessageBuilder::TestInitMessageBuilder((TestInitMessageBuilder *)local_2a0,local_2b0);
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_2d8,(MessageBuilder *)local_2a0);
    builder_01._builder.capTable = (CapTableBuilder *)local_2d8._builder.data;
    builder_01._builder.segment = (SegmentBuilder *)local_2d8._builder.capTable;
    builder_01._builder.data = local_2d8._builder.pointers;
    builder_01._builder.pointers = (WirePointer *)local_2d8._builder._32_8_;
    builder_01._builder.dataSize = in_stack_fffffffffffffb50;
    builder_01._builder._36_4_ = in_stack_fffffffffffffb54;
    checkTestMessage(builder_01);
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              ((Builder *)&_kjCondition_1.result,(MessageBuilder *)local_2a0);
    capnproto_test::capnp::test::TestAllTypes::Builder::setInt64Field
              ((Builder *)&_kjCondition_1.result,0x1e1b9);
    local_330 = 0x1e1b9;
    local_32c = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_330);
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              ((Builder *)local_360,(MessageBuilder *)local_100);
    local_338 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                          ((Builder *)local_360);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_long> *)local_328,&local_32c,&local_338);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_328);
    if (!bVar1) {
      local_361 = kj::_::Debug::shouldLog(ERROR);
      while (local_361 != false) {
        local_368 = 0x1e1b9;
        MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
                  ((Builder *)&_kjCondition_2.result,(MessageBuilder *)local_100);
        local_370 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                              ((Builder *)&_kjCondition_2.result);
        kj::_::Debug::log<char_const(&)[79],kj::_::DebugComparison<int,long>&,int,long>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
                   ,0x73,ERROR,
                   "\"failed: expected \" \"(123321) == (builder.getRoot<TestAllTypes>().getInt64Field())\", _kjCondition, 123321, builder.getRoot<TestAllTypes>().getInt64Field()"
                   ,(char (*) [79])
                    "failed: expected (123321) == (builder.getRoot<TestAllTypes>().getInt64Field())"
                   ,(DebugComparison<int,_long> *)local_328,&local_368,&local_370);
        local_361 = false;
      }
    }
    local_3c8 = 0;
    local_3c4 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3c8);
    sStack_3d0 = kj::Vector<kj::Array<capnp::word>_>::size
                           ((Vector<kj::Array<capnp::word>_> *)
                            &builder2.super_MessageBuilder.allocatedArena);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_unsigned_long> *)local_3c0,&local_3c4,&stack0xfffffffffffffc30)
    ;
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3c0);
    if (!bVar1) {
      local_3d1 = kj::_::Debug::shouldLog(ERROR);
      while (local_3d1 != false) {
        local_3d8 = 0;
        local_3e0 = kj::Vector<kj::Array<capnp::word>_>::size
                              ((Vector<kj::Array<capnp::word>_> *)
                               &builder2.super_MessageBuilder.allocatedArena);
        kj::_::Debug::
        log<char_const(&)[54],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
                   ,0x76,ERROR,
                   "\"failed: expected \" \"(0) == (builder2.allocations.size())\", _kjCondition, 0, builder2.allocations.size()"
                   ,(char (*) [54])"failed: expected (0) == (builder2.allocations.size())",
                   (DebugComparison<int,_unsigned_long> *)local_3c0,&local_3d8,&local_3e0);
        local_3d1 = false;
      }
    }
    MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
              (&local_408,(MessageBuilder *)local_2a0);
    Text::Reader::Reader((Reader *)&_kjCondition_3.result,"foobarbaz");
    capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
              (&local_408,(Reader)stack0xfffffffffffffbe8);
    local_448 = 1;
    local_444 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_448);
    sStack_450 = kj::Vector<kj::Array<capnp::word>_>::size
                           ((Vector<kj::Array<capnp::word>_> *)
                            &builder2.super_MessageBuilder.allocatedArena);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_unsigned_long> *)local_440,&local_444,&stack0xfffffffffffffbb0)
    ;
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_440);
    if (!bVar1) {
      local_451 = kj::_::Debug::shouldLog(ERROR);
      while (local_451 != false) {
        local_458 = 1;
        local_460 = kj::Vector<kj::Array<capnp::word>_>::size
                              ((Vector<kj::Array<capnp::word>_> *)
                               &builder2.super_MessageBuilder.allocatedArena);
        kj::_::Debug::
        log<char_const(&)[54],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
                   ,0x78,ERROR,
                   "\"failed: expected \" \"(1) == (builder2.allocations.size())\", _kjCondition, 1, builder2.allocations.size()"
                   ,(char (*) [54])"failed: expected (1) == (builder2.allocations.size())",
                   (DebugComparison<int,_unsigned_long> *)local_440,&local_458,&local_460);
        local_451 = false;
      }
    }
    TestInitMessageBuilder::~TestInitMessageBuilder((TestInitMessageBuilder *)local_2a0);
    kj::Array<capnp::MessageBuilder::SegmentInit>::~Array
              ((Array<capnp::MessageBuilder::SegmentInit> *)local_1b0);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_100);
    return;
  }
  local_18c = 1;
  segInits.disposer =
       (ArrayDisposer *)
       kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                 ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message-test.c++"
             ,0x67,FAILED,"(1) != (segs.size())","_kjCondition,1, segs.size()",
             (DebugComparison<int,_unsigned_long> *)local_170,&local_18c,
             (unsigned_long *)&segInits.disposer);
  kj::_::Debug::Fault::fatal(&local_188);
}

Assistant:

TEST(Message, MessageBuilderInitMultiSegment) {
  // Same as previous test, but with a message containing many segments.

  MallocMessageBuilder builder(1, AllocationStrategy::FIXED_SIZE);
  initTestMessage(builder.getRoot<TestAllTypes>());

  // Pull the segments out and make a segment init table out of them.
  //
  // We const_cast for simplicity of implementing the test, but you shouldn't do that at home. :)
  auto segs = builder.getSegmentsForOutput();
  ASSERT_NE(1, segs.size());

  auto segInits = KJ_MAP(seg, segs) -> MessageBuilder::SegmentInit {
    return { kj::arrayPtr(const_cast<word*>(seg.begin()), seg.size()), seg.size() };
  };

  // Init a new builder from the old segments.
  TestInitMessageBuilder builder2(segInits);
  checkTestMessage(builder2.getRoot<TestAllTypes>());

  // Verify that they're really using the same underlying memory.
  builder2.getRoot<TestAllTypes>().setInt64Field(123321);
  EXPECT_EQ(123321, builder.getRoot<TestAllTypes>().getInt64Field());

  // Force builder2 to allocate new space.
  EXPECT_EQ(0, builder2.allocations.size());
  builder2.getRoot<TestAllTypes>().setTextField("foobarbaz");
  EXPECT_EQ(1, builder2.allocations.size());
}